

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

VarStatus __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::basisStatusToVarStatus
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Status stat)

{
  uint uVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  uVar1 = stat + D_ON_BOTH;
  if ((uVar1 < 0xf) && ((0x55b5U >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(VarStatus *)(&DAT_00612df0 + (ulong)uVar1 * 4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ESOLVE26 ERROR: unknown basis status (",0x26);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,stat);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"XSOLVE22 This should never happen.","");
  *puVar3 = &PTR__SPxException_006a9ee8;
  puVar3[1] = puVar3 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 1),local_40,local_40 + local_38);
  *puVar3 = &PTR__SPxException_006a9ec0;
  __cxa_throw(puVar3,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
}

Assistant:

typename SPxSolverBase<R>::VarStatus
   SPxSolverBase<R>::basisStatusToVarStatus(typename SPxBasisBase<R>::Desc::Status stat) const
   {
      VarStatus vstat;

      switch(stat)
      {
      case SPxBasisBase<R>::Desc::P_ON_LOWER:
         vstat = ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER:
         vstat = ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         vstat = FIXED;
         break;

      case SPxBasisBase<R>::Desc::P_FREE:
         vstat = ZERO;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER:
      case SPxBasisBase<R>::Desc::D_ON_LOWER:
      case SPxBasisBase<R>::Desc::D_ON_BOTH:
      case SPxBasisBase<R>::Desc::D_UNDEFINED:
      case SPxBasisBase<R>::Desc::D_FREE:
         vstat = BASIC;
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ESOLVE26 ERROR: unknown basis status (" << static_cast<int>(stat) << ")"
                       << std::endl;)
         throw SPxInternalCodeException("XSOLVE22 This should never happen.");
      }

      return vstat;
   }